

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::StreamingListener
          (StreamingListener *this,string *host,string *port)

{
  SocketWriter *this_00;
  string *port_local;
  string *host_local;
  StreamingListener *this_local;
  
  EmptyTestEventListener::EmptyTestEventListener(&this->super_EmptyTestEventListener);
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__StreamingListener_00205888;
  this_00 = (SocketWriter *)operator_new(0x50);
  SocketWriter::SocketWriter(this_00,host,port);
  std::
  unique_ptr<testing::internal::StreamingListener::AbstractSocketWriter,std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>>
  ::unique_ptr<std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>,void>
            ((unique_ptr<testing::internal::StreamingListener::AbstractSocketWriter,std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>>
              *)&this->socket_writer_,(pointer)this_00);
  Start(this);
  return;
}

Assistant:

StreamingListener(const std::string& host, const std::string& port)
      : socket_writer_(new SocketWriter(host, port)) {
    Start();
  }